

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O0

void __thiscall
PoolResource<144UL,_8UL>::PoolResource(PoolResource<144UL,_8UL> *this,size_t chunk_size_bytes)

{
  long lVar1;
  size_t sVar2;
  ulong *in_RDI;
  long in_FS_OFFSET;
  list<std::byte_*,_std::allocator<std::byte_*>_> *in_stack_ffffffffffffffb8;
  PoolResource<144UL,_8UL> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = NumElemAlignBytes((size_t)in_stack_ffffffffffffffb8);
  *in_RDI = sVar2 << 3;
  memset(in_RDI + 1,0,0x18);
  std::__cxx11::list<std::byte_*,_std::allocator<std::byte_*>_>::list(in_stack_ffffffffffffffb8);
  memset(in_RDI + 4,0,0x98);
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  if (*in_RDI < 0x90) {
    __assert_fail("m_chunk_size_bytes >= MAX_BLOCK_SIZE_BYTES",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/support/allocators/pool.h"
                  ,0xb4,
                  "PoolResource<144, 8>::PoolResource(std::size_t) [MAX_BLOCK_SIZE_BYTES = 144, ALIGN_BYTES = 8]"
                 );
  }
  AllocateChunk(in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PoolResource(std::size_t chunk_size_bytes)
        : m_chunk_size_bytes(NumElemAlignBytes(chunk_size_bytes) * ELEM_ALIGN_BYTES)
    {
        assert(m_chunk_size_bytes >= MAX_BLOCK_SIZE_BYTES);
        AllocateChunk();
    }